

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O0

bool draco::WriteBufferToFile(char *buffer,size_t buffer_size,string *file_name)

{
  bool bVar1;
  int iVar2;
  pointer pFVar3;
  string *in_RSI;
  undefined8 in_RDI;
  unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
  file_writer;
  nullptr_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  bool local_1;
  
  FileWriterFactory::OpenWriter(in_RSI);
  bVar1 = std::operator==((unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
                           *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
  if (bVar1) {
    local_1 = false;
  }
  else {
    pFVar3 = std::
             unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
             ::operator->((unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
                           *)0x110b4f);
    iVar2 = (*pFVar3->_vptr_FileWriterInterface[2])(pFVar3,in_RDI,in_RSI);
    local_1 = (bool)((byte)iVar2 & 1);
  }
  std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>::
  ~unique_ptr((unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
               *)CONCAT44(1,in_stack_ffffffffffffffd0));
  return local_1;
}

Assistant:

bool WriteBufferToFile(const char *buffer, size_t buffer_size,
                       const std::string &file_name) {
  std::unique_ptr<FileWriterInterface> file_writer =
      FileWriterFactory::OpenWriter(file_name);
  if (file_writer == nullptr) {
    return false;
  }
  return file_writer->Write(buffer, buffer_size);
}